

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

ThreadLog * __thiscall deqp::egl::ThreadLog::operator<<(ThreadLog *this,EndMessageToken *param_1)

{
  deUint64 dVar1;
  allocator<char> local_69;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long *local_40;
  long local_30 [2];
  
  dVar1 = deGetMicroseconds();
  std::__cxx11::stringbuf::str();
  local_68 = (undefined1  [8])dVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)local_40,&local_69)
  ;
  std::vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>::
  emplace_back<deqp::egl::ThreadLog::Message>(&this->m_messages,(Message *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_68 = (undefined1  [8])&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,0x1aee929);
  std::__cxx11::stringbuf::str
            ((string *)
             &(this->m_message).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  if (local_68 != (undefined1  [8])&local_58) {
    operator_delete((void *)local_68,local_58 + 1);
  }
  return this;
}

Assistant:

ThreadLog& ThreadLog::operator<< (const EndMessageToken&)
{
	m_messages.push_back(Message(deGetMicroseconds(), m_message.str().c_str()));
	m_message.str("");
	return *this;
}